

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O1

void __thiscall
duckdb::WindowSegmentTreePart::ExtractFrame
          (WindowSegmentTreePart *this,idx_t begin,idx_t end,data_ptr_t state_ptr)

{
  data_ptr_t pdVar1;
  bool *pbVar2;
  idx_t iVar3;
  pointer pWVar4;
  long lVar5;
  sel_t sVar6;
  idx_t i;
  
  pdVar1 = (this->statep).data;
  if (this->filter_mask->validity_mask == (bool *)0x0) {
    pWVar4 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
             operator->(&this->cursor);
    if (end != begin) {
      lVar5 = end - begin;
      sVar6 = (int)begin - (int)(pWVar4->state).current_row_index;
      do {
        iVar3 = this->flush_count;
        *(data_ptr_t *)(pdVar1 + iVar3 * 8) = state_ptr;
        this->flush_count = iVar3 + 1;
        (this->filter_sel).sel_vector[iVar3] = sVar6;
        if (0x7ff < iVar3 + 1) {
          FlushStates(this,false);
        }
        sVar6 = sVar6 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  else if (begin < end) {
    do {
      pbVar2 = this->filter_mask->validity_mask;
      if ((pbVar2 == (bool *)0x0) || (pbVar2[begin] == true)) {
        iVar3 = this->flush_count;
        *(data_ptr_t *)(pdVar1 + iVar3 * 8) = state_ptr;
        this->flush_count = iVar3 + 1;
        pWVar4 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
                 operator->(&this->cursor);
        (this->filter_sel).sel_vector[iVar3] = (int)begin - (int)(pWVar4->state).current_row_index;
        if (0x7ff < this->flush_count) {
          FlushStates(this,false);
        }
      }
      begin = begin + 1;
    } while (end != begin);
  }
  return;
}

Assistant:

void WindowSegmentTreePart::ExtractFrame(idx_t begin, idx_t end, data_ptr_t state_ptr) {
	const auto count = end - begin;

	//	If we are not filtering,
	//	just update the shared dictionary selection to the range
	//	Otherwise set it to the input rows that pass the filter
	auto states = FlatVector::GetData<data_ptr_t>(statep);
	if (filter_mask.AllValid()) {
		const auto offset = cursor->RowOffset(begin);
		for (idx_t i = 0; i < count; ++i) {
			states[flush_count] = state_ptr;
			filter_sel.set_index(flush_count++, offset + i);
			if (flush_count >= STANDARD_VECTOR_SIZE) {
				FlushStates(false);
			}
		}
	} else {
		for (idx_t i = begin; i < end; ++i) {
			if (filter_mask.RowIsValid(i)) {
				states[flush_count] = state_ptr;
				filter_sel.set_index(flush_count++, cursor->RowOffset(i));
				if (flush_count >= STANDARD_VECTOR_SIZE) {
					FlushStates(false);
				}
			}
		}
	}
}